

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O2

CURLcode Curl_dyn_vaddf(dynbuf *s,char *fmt,__va_list_tag *ap)

{
  CURLcode CVar1;
  CURLcode CVar2;
  
  CVar2 = Curl_dyn_vprintf(s,fmt,ap);
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (CVar2 == CURLE_FAILED_INIT) {
    CVar1 = CURLE_TOO_LARGE;
  }
  if (CVar2 != CURLE_OK) {
    CVar2 = CVar1;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_dyn_vaddf(struct dynbuf *s, const char *fmt, va_list ap)
{
#ifdef BUILDING_LIBCURL
  int rc;
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(fmt);
  rc = Curl_dyn_vprintf(s, fmt, ap);

  if(!rc)
    return CURLE_OK;
  else if(rc == MERR_TOO_LARGE)
    return CURLE_TOO_LARGE;
  return CURLE_OUT_OF_MEMORY;
#else
  char *str;
  str = vaprintf(fmt, ap); /* this allocs a new string to append */

  if(str) {
    CURLcode result = dyn_nappend(s, (unsigned char *)str, strlen(str));
    free(str);
    return result;
  }
  /* If we failed, we cleanup the whole buffer and return error */
  Curl_dyn_free(s);
  return CURLE_OUT_OF_MEMORY;
#endif
}